

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O3

void __thiscall Tree<int>::levelEasyTraversal(Tree<int> *this)

{
  TCallBack<int> *pTVar1;
  _func_int_ptr_int_ptr *p_Var2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 extraout_var;
  Node<int> *pNVar7;
  undefined8 uVar8;
  int *piVar9;
  queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> myQueue;
  Node<int> node;
  _Deque_base<Node<int>,_std::allocator<Node<int>_>_> local_b8;
  undefined **local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  int *local_48;
  undefined8 uStack_40;
  Node<int> *local_38;
  undefined4 extraout_var_00;
  
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Node<int>,_std::allocator<Node<int>_>_>::_M_initialize_map(&local_b8,0);
  iVar6 = (*this->_vptr_Tree[8])(this);
  if (CONCAT44(extraout_var,iVar6) != 0) {
    iVar6 = (*this->_vptr_Tree[8])(this);
    pNVar7 = (Node<int> *)CONCAT44(extraout_var_00,iVar6);
    if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<Node<int>,std::allocator<Node<int>>>::_M_push_back_aux<Node<int>const&>
                ((deque<Node<int>,std::allocator<Node<int>>> *)&local_b8,pNVar7);
    }
    else {
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->_vptr_Node =
           (_func_int **)&PTR_getLeftPoint_00106d58;
      iVar6 = pNVar7->leftValue;
      uVar3 = *(undefined4 *)&pNVar7->field_0x14;
      piVar9 = pNVar7->dataNode;
      iVar4 = pNVar7->rightValue;
      uVar5 = *(undefined4 *)&pNVar7->field_0x24;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftPoint = pNVar7->leftPoint;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftValue = iVar6;
      *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x14 = uVar3
      ;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->dataNode = piVar9;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightValue = iVar4;
      *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x24 = uVar5
      ;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightPoint = pNVar7->rightPoint;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_60 = &PTR_getLeftPoint_00106d58;
      local_38 = (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->rightPoint;
      local_58 = *(undefined4 *)
                  &(local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->leftPoint;
      uStack_54 = *(undefined4 *)
                   ((long)&(local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->leftPoint + 4)
      ;
      iStack_50 = (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->leftValue;
      uStack_4c = *(undefined4 *)
                   &(local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->field_0x14;
      local_48 = (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->dataNode;
      uStack_40 = *(undefined8 *)
                   &(local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->rightValue;
      if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pTVar1 = this->callBack;
      if (pTVar1 != (TCallBack<int> *)0x0) {
        uVar8 = (*(code *)local_60[4])(&local_60);
        (*(code *)**(undefined8 **)pTVar1)(pTVar1,uVar8);
      }
      p_Var2 = this->fCallBack;
      if (p_Var2 != (_func_int_ptr_int_ptr *)0x0) {
        piVar9 = (int *)(*(code *)local_60[4])(&local_60);
        (*p_Var2)(piVar9);
      }
      pNVar7 = (Node<int> *)CONCAT44(uStack_54,local_58);
      if (pNVar7 != (Node<int> *)0x0) {
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Node<int>,std::allocator<Node<int>>>::_M_push_back_aux<Node<int>const&>
                    ((deque<Node<int>,std::allocator<Node<int>>> *)&local_b8,pNVar7);
        }
        else {
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->_vptr_Node =
               (_func_int **)&PTR_getLeftPoint_00106d58;
          iVar6 = pNVar7->leftValue;
          uVar3 = *(undefined4 *)&pNVar7->field_0x14;
          piVar9 = pNVar7->dataNode;
          iVar4 = pNVar7->rightValue;
          uVar5 = *(undefined4 *)&pNVar7->field_0x24;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftPoint = pNVar7->leftPoint;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftValue = iVar6;
          *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x14 =
               uVar3;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->dataNode = piVar9;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightValue = iVar4;
          *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x24 =
               uVar5;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightPoint =
               pNVar7->rightPoint;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      if (local_38 != (Node<int> *)0x0) {
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Node<int>,std::allocator<Node<int>>>::_M_push_back_aux<Node<int>const&>
                    ((deque<Node<int>,std::allocator<Node<int>>> *)&local_b8,local_38);
        }
        else {
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->_vptr_Node =
               (_func_int **)&PTR_getLeftPoint_00106d58;
          iVar6 = local_38->leftValue;
          uVar3 = *(undefined4 *)&local_38->field_0x14;
          piVar9 = local_38->dataNode;
          iVar4 = local_38->rightValue;
          uVar5 = *(undefined4 *)&local_38->field_0x24;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftPoint =
               local_38->leftPoint;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->leftValue = iVar6;
          *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x14 =
               uVar3;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->dataNode = piVar9;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightValue = iVar4;
          *(undefined4 *)&(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x24 =
               uVar5;
          (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->rightPoint =
               local_38->rightPoint;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<Node<int>,_std::allocator<Node<int>_>_>::~_Deque_base(&local_b8);
  return;
}

Assistant:

virtual void levelEasyTraversal(void){
        //queue of std
        queue< Node<T> >  myQueue;
        if (getRoot() != nullptr){
            myQueue.push(* getRoot()); // this function receive reference var
        }
        while (!myQueue.empty()){
            //get the first node
            Node<T> node = myQueue.front();
            //pop
            myQueue.pop();
            //my business logic, call back
            doSomeThing(&node);
            //deal with children
            if (node.getLeftPoint() != nullptr){
                myQueue.push(* node.getLeftPoint());
            }
            if (node.getRightPoint() != nullptr){
                myQueue.push(* node.getRightPoint());
            }
        }
    }